

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explain_statement.cpp
# Opt level: O2

string * __thiscall
duckdb::ExplainStatement::OptionsToString_abi_cxx11_
          (string *__return_storage_ptr__,ExplainStatement *this)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  allocator local_71;
  string local_70;
  string local_50 [32];
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->explain_type == EXPLAIN_ANALYZE) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    sVar1 = __return_storage_ptr__->_M_string_length;
    if (this->explain_format == DEFAULT) goto LAB_006556c0;
    if (sVar1 == 0) goto LAB_0065564a;
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    if (this->explain_format == DEFAULT) {
      return __return_storage_ptr__;
    }
LAB_0065564a:
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::string(local_50,"FORMAT %s",&local_71);
  EnumUtil::ToString<duckdb::ExplainFormat>(&local_70,this->explain_format);
  StringUtil::Format<std::__cxx11::string>(&local_30,(StringUtil *)local_50,&local_70,in_RCX);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string(local_50);
  sVar1 = __return_storage_ptr__->_M_string_length;
LAB_006556c0:
  if (sVar1 != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string ExplainStatement::OptionsToString() const {
	string options;
	if (explain_type == ExplainType::EXPLAIN_ANALYZE) {
		options += "(";
		options += "ANALYZE";
	}
	if (explain_format != ExplainFormat::DEFAULT) {
		if (options.empty()) {
			options += "(";
		} else {
			options += ", ";
		}
		options += StringUtil::Format("FORMAT %s", EnumUtil::ToString(explain_format));
	}
	if (!options.empty()) {
		options += ")";
	}
	return options;
}